

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O3

int __thiscall ncnn::Padding::forward(Padding *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float v;
  uint _c;
  int *piVar1;
  size_t _elemsize;
  float *pfVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  Mat local_b0;
  Mat local_70;
  
  if (((this->top == 0 && this->bottom == 0) && this->left == 0) && this->right == 0) {
    iVar4 = 0;
    if (top_blob != bottom_blob) {
      piVar1 = bottom_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = top_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar1 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar1;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar4 = bottom_blob->w;
      iVar5 = bottom_blob->h;
      iVar3 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar4;
      top_blob->h = iVar5;
      top_blob->c = iVar3;
      top_blob->cstep = bottom_blob->cstep;
      iVar4 = 0;
    }
  }
  else {
    iVar4 = bottom_blob->dims;
    _elemsize = bottom_blob->elemsize;
    iVar5 = this->right + this->left + bottom_blob->w;
    if (iVar4 == 1) {
      Mat::create(top_blob,iVar5,_elemsize,opt->blob_allocator);
      iVar4 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (_elemsize == 4) {
          iVar4 = 0;
          copy_make_border_image<float>(bottom_blob,top_blob,0,this->left,this->type,this->value);
        }
        else if (_elemsize == 2) {
          iVar4 = 0;
          copy_make_border_image<unsigned_short>
                    (bottom_blob,top_blob,0,this->left,this->type,
                     *(unsigned_short *)((long)&this->value + 2));
        }
        else {
          iVar4 = 0;
          if (_elemsize == 1) {
            iVar4 = 0;
            copy_make_border_image<signed_char>
                      (bottom_blob,top_blob,0,this->left,this->type,(char)(int)this->value);
          }
        }
      }
    }
    else {
      iVar3 = this->bottom + this->top + bottom_blob->h;
      if (iVar4 == 3) {
        _c = bottom_blob->c;
        Mat::create(top_blob,iVar5,iVar3,_c,_elemsize,opt->blob_allocator);
        iVar4 = -100;
        if (((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
           (iVar4 = 0, 0 < (int)_c)) {
          uVar6 = 0;
          iVar4 = 0;
          do {
            local_70.w = bottom_blob->w;
            local_70.h = bottom_blob->h;
            local_70.elemsize = bottom_blob->elemsize;
            local_70.data =
                 (void *)(bottom_blob->cstep * uVar6 * local_70.elemsize + (long)bottom_blob->data);
            local_70.elempack = bottom_blob->elempack;
            local_70.allocator = bottom_blob->allocator;
            local_70.refcount = (int *)0x0;
            local_70.dims = 2;
            local_70.c = 1;
            local_70.cstep = (size_t)(local_70.h * local_70.w);
            local_b0.w = top_blob->w;
            local_b0.elemsize = top_blob->elemsize;
            local_b0.data =
                 (void *)(top_blob->cstep * uVar6 * local_b0.elemsize + (long)top_blob->data);
            local_b0.h = top_blob->h;
            local_b0.elempack = top_blob->elempack;
            local_b0.allocator = top_blob->allocator;
            local_b0.refcount = (int *)0x0;
            local_b0.dims = 2;
            local_b0.c = 1;
            local_b0.cstep = (size_t)(local_b0.h * local_b0.w);
            pfVar2 = (float *)(uVar6 * 4 + (long)(this->per_channel_pad_data).data);
            if (this->per_channel_pad_data_size == 0) {
              pfVar2 = &this->value;
            }
            v = *pfVar2;
            if (_elemsize == 4) {
              copy_make_border_image<float>(&local_70,&local_b0,this->top,this->left,this->type,v);
            }
            else if (_elemsize == 2) {
              copy_make_border_image<unsigned_short>
                        (&local_70,&local_b0,this->top,this->left,this->type,
                         (unsigned_short)((uint)v >> 0x10));
            }
            else if (_elemsize == 1) {
              copy_make_border_image<signed_char>
                        (&local_70,&local_b0,this->top,this->left,this->type,(char)(int)v);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != _c);
        }
      }
      else {
        if (iVar4 == 2) {
          Mat::create(top_blob,iVar5,iVar3,_elemsize,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          if (_elemsize == 4) {
            copy_make_border_image<float>
                      (bottom_blob,top_blob,this->top,this->left,this->type,this->value);
          }
          else if (_elemsize == 2) {
            copy_make_border_image<unsigned_short>
                      (bottom_blob,top_blob,this->top,this->left,this->type,
                       *(unsigned_short *)((long)&this->value + 2));
          }
          else if (_elemsize == 1) {
            copy_make_border_image<signed_char>
                      (bottom_blob,top_blob,this->top,this->left,this->type,(char)(int)this->value);
          }
        }
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int Padding::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + left + right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, 0, left, type, float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, left, type, value);

        return 0;
    }

    int outh = h + top + bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, top, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, top, left, type, float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, top, left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob.channel(q);
            Mat borderm = top_blob.channel(q);

            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            if (elemsize == 1)
                copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
            if (elemsize == 2)
                copy_make_border_image<unsigned short>(m, borderm, top, left, type, float32_to_bfloat16(pad_value));
            if (elemsize == 4)
                copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
        }

        return 0;
    }

    return 0;
}